

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  FILE *pFVar12;
  void *pvVar13;
  void *pvVar14;
  xmlTextReaderPtr reader;
  undefined4 uVar15;
  undefined1 *puVar16;
  int iVar17;
  uint uVar18;
  int in_R9D;
  ulong uVar19;
  glob_t globbuf;
  char prefix [500];
  char result [500];
  char err [500];
  char pattern [500];
  int iStack_19b8;
  glob64_t gStack_19a0;
  undefined4 uStack_1958;
  undefined4 uStack_1954;
  short sStack_1950;
  char acStack_1758 [499];
  undefined1 uStack_1565;
  char acStack_1558 [499];
  undefined1 uStack_1365;
  char acStack_1358 [499];
  undefined1 uStack_1165;
  char *pcStack_1160;
  undefined8 uStack_1158;
  long lStack_1150;
  long lStack_1148;
  ulong uStack_1140;
  code *pcStack_1138;
  undefined8 uStack_1130;
  char *pcStack_1128;
  undefined4 uStack_111c;
  long lStack_1118;
  long lStack_1110;
  glob64_t gStack_1108;
  char acStack_10c0 [499];
  undefined1 uStack_ecd;
  undefined1 auStack_ec0 [512];
  char acStack_cc0 [499];
  undefined1 uStack_acd;
  char acStack_ac0 [499];
  undefined1 uStack_8cd;
  char *pcStack_8c8;
  long lStack_8c0;
  undefined8 uStack_8b8;
  long lStack_8b0;
  ulong uStack_8a8;
  code *pcStack_8a0;
  undefined8 local_898;
  char *local_890;
  int local_884;
  long local_880;
  long local_878;
  glob64_t local_870;
  undefined1 local_828 [512];
  char local_628 [499];
  undefined1 local_435;
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcStack_8a0 = (code *)0x108ef3;
  local_884 = options;
  pcVar5 = baseFilename(filename);
  pcStack_8a0 = (code *)0x108f03;
  local_890 = filename;
  uVar6 = xmlSchemaNewParserCtxt(filename);
  pcStack_8a0 = (code *)0x108f1b;
  xmlSchemaSetParserErrors(uVar6,testErrorHandler,testErrorHandler,uVar6);
  pcStack_8a0 = (code *)0x108f23;
  lVar7 = xmlSchemaParse(uVar6);
  pcStack_8a0 = (code *)0x108f2e;
  xmlSchemaFreeParserCtxt(uVar6);
  iVar4 = testErrorsSize;
  pcStack_8a0 = (code *)0x108f3c;
  sVar8 = strlen(pcVar5);
  iVar3 = (int)sVar8;
  if (iVar3 - 500U < 0xfffffe11) {
    pcStack_8a0 = (code *)0x108f52;
    xmlSchemaFree(lVar7);
    iVar3 = -1;
  }
  else {
    iVar17 = iVar3 + -6;
    if (pcVar5[(long)iVar3 + -6] != '_') {
      iVar17 = iVar3 + -4;
    }
    if (pcVar5[(long)iVar17 + -2] == '_') {
      iVar17 = iVar17 + -2;
    }
    sVar8 = (size_t)iVar17;
    pcStack_8a0 = (code *)0x108f98;
    local_880 = lVar7;
    memcpy(local_828,pcVar5,sVar8);
    local_828[sVar8] = 0;
    pcStack_8a0 = (code *)0x108fbc;
    iVar3 = snprintf(local_228,499,"./test/schemas/%s_*.xml",local_828);
    if (0x1f2 < iVar3) {
      local_35 = 0;
    }
    if (pcVar5[sVar8] == '_') {
      pcStack_8a0 = (code *)0x108fe3;
      memcpy(local_828,pcVar5,sVar8 + 2);
      local_828[sVar8 + 2] = 0;
    }
    local_870.gl_offs = 0;
    local_898 = 0;
    pcStack_8a0 = (code *)0x109015;
    glob64(local_228,8,(__errfunc *)0x0,&local_870);
    lVar7 = local_880;
    if (local_870.gl_pathc != 0) {
      local_878 = (long)iVar4;
      uVar19 = 0;
      local_898 = 0;
      do {
        testErrorsSize = (int)local_878;
        testErrors[local_878] = '\0';
        pcVar5 = local_870.gl_pathv[uVar19];
        pcStack_8a0 = (code *)0x109064;
        pcVar9 = baseFilename(pcVar5);
        pcStack_8a0 = (code *)0x10906f;
        sVar8 = strlen(pcVar9);
        iVar3 = (int)sVar8;
        if ((iVar3 < 7) || (pcVar9[iVar3 - 6] != '_')) {
          pcStack_8a0 = (code *)0x10924e;
          fprintf(_stderr,"don\'t know how to process %s\n",pcVar5);
        }
        else {
          uVar18 = (uint)pcVar9[iVar3 - 5];
          pcStack_8a0 = (code *)0x1090b4;
          iVar3 = snprintf(local_628,499,"result/schemas/%s_%c",local_828,(ulong)uVar18);
          if (0x1f2 < iVar3) {
            local_435 = 0;
          }
          puVar16 = local_828;
          pcStack_8a0 = (code *)0x1090e6;
          iVar3 = snprintf(local_428,499,"result/schemas/%s_%c.err",puVar16,(ulong)uVar18);
          uVar15 = SUB84(puVar16,0);
          if (0x1f2 < iVar3) {
            local_235 = 0;
          }
          if (lVar7 != 0) {
            nb_tests = nb_tests + 1;
            pcStack_8a0 = (code *)0x109112;
            lVar10 = xmlReadFile(pcVar5,0,local_884);
            if (lVar10 == 0) {
              pcStack_8a0 = (code *)0x10929b;
              fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar5,local_890);
              local_898 = 0xffffffff;
            }
            else {
              pcVar9 = local_628;
              pcStack_8a0 = (code *)0x109139;
              pcVar11 = resultFilename(pcVar9,temp_directory,".res");
              if (pcVar11 == (char *)0x0) {
                pcStack_8a0 = rngTest;
                schemasTest_cold_2();
                uStack_8b8 = 0xfffffffa;
                pcStack_1138 = (code *)0x10933a;
                uStack_111c = uVar15;
                pcStack_8c8 = pcVar5;
                lStack_8c0 = lVar7;
                lStack_8b0 = lVar10;
                uStack_8a8 = uVar19;
                pcStack_8a0 = (code *)(ulong)uVar18;
                pcVar5 = baseFilename(pcVar9);
                pcStack_1138 = (code *)0x10934a;
                pcStack_1128 = pcVar9;
                pvVar13 = (void *)xmlRelaxNGNewParserCtxt(pcVar9);
                pcStack_1138 = (code *)0x109362;
                xmlRelaxNGSetParserErrors(pvVar13,testErrorHandler,testErrorHandler,pvVar13);
                pcStack_1138 = (code *)0x10936a;
                lVar7 = xmlRelaxNGParse(pvVar13);
                pcStack_1138 = (code *)0x109375;
                xmlRelaxNGFreeParserCtxt();
                if (lVar7 == 0) {
                  pcStack_1138 = (code *)0x10938d;
                  testErrorHandler(pvVar13,"Relax-NG schema %s failed to compile\n",pcStack_1128);
                }
                iVar3 = testErrorsSize;
                pcStack_1138 = (code *)0x10939b;
                sVar8 = strlen(pcVar5);
                if ((int)sVar8 - 500U < 0xfffffe11) {
                  pcStack_1138 = (code *)0x1093b2;
                  xmlRelaxNGFree(lVar7);
                  return -1;
                }
                uVar19 = (ulong)((int)sVar8 - 4);
                pcStack_1138 = (code *)0x1093d6;
                memcpy(auStack_ec0,pcVar5,uVar19);
                auStack_ec0[uVar19] = 0;
                uStack_1130 = 0;
                pcStack_1138 = (code *)0x109405;
                iVar4 = snprintf(acStack_ac0,499,"./test/relaxng/%s_?.xml",auStack_ec0);
                if (0x1f2 < iVar4) {
                  uStack_8cd = 0;
                }
                gStack_1108.gl_offs = 0;
                pcStack_1138 = (code *)0x109438;
                glob64(acStack_ac0,8,(__errfunc *)0x0,&gStack_1108);
                if (gStack_1108.gl_pathc == 0) goto LAB_00109704;
                lStack_1110 = (long)iVar3;
                uVar19 = 0;
                uStack_1130 = 0;
                lStack_1118 = lVar7;
                goto LAB_00109460;
              }
              pcStack_8a0 = (code *)0x109154;
              pFVar12 = fopen64(pcVar11,"wb");
              if (pFVar12 == (FILE *)0x0) {
                pcStack_8a0 = (code *)0x1092b4;
                schemasTest_cold_1();
                local_898 = 0xffffffff;
              }
              else {
                pcStack_8a0 = (code *)0x109168;
                uVar6 = xmlSchemaNewValidCtxt(lVar7);
                pcStack_8a0 = (code *)0x109180;
                xmlSchemaSetValidErrors(uVar6,testErrorHandler,testErrorHandler,uVar6);
                pcStack_8a0 = (code *)0x10918b;
                iVar3 = xmlSchemaValidateDoc(uVar6,lVar10);
                pcVar9 = "%s validation generated an internal error\n";
                if (0 < iVar3) {
                  pcVar9 = "%s fails to validate\n";
                }
                if (iVar3 == 0) {
                  pcVar9 = "%s validates\n";
                }
                pcStack_8a0 = (code *)0x1091b7;
                fprintf(pFVar12,pcVar9,pcVar5);
                pcStack_8a0 = (code *)0x1091bf;
                fclose(pFVar12);
                pcStack_8a0 = (code *)0x1091cf;
                iVar3 = compareFiles(pcVar11,local_628);
                if (iVar3 != 0) {
                  pcStack_8a0 = (code *)0x1092e2;
                  fprintf(_stderr,"Result for %s on %s failed\n",pcVar5,local_890);
                  local_898 = 1;
                }
                pcStack_8a0 = (code *)0x1091df;
                unlink(pcVar11);
                pcStack_8a0 = (code *)0x1091e7;
                free(pcVar11);
                pcStack_8a0 = (code *)0x1091ef;
                xmlSchemaFreeValidCtxt(uVar6);
                pcStack_8a0 = (code *)0x1091f7;
                xmlFreeDoc(lVar10);
                lVar7 = local_880;
              }
            }
          }
          pcStack_8a0 = (code *)0x10921c;
          iVar3 = compareFileMem(local_428,testErrors,testErrorsSize);
          if (iVar3 != 0) {
            pcStack_8a0 = (code *)0x109270;
            fprintf(_stderr,"Error for %s on %s failed\n",pcVar5,local_890);
            local_898 = 1;
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < local_870.gl_pathc);
    }
    pcStack_8a0 = (code *)0x1092fa;
    globfree64(&local_870);
    pcStack_8a0 = (code *)0x109302;
    xmlSchemaFree(lVar7);
    iVar3 = (int)local_898;
  }
  return iVar3;
LAB_00109460:
  testErrorsSize = (int)lStack_1110;
  testErrors[lStack_1110] = '\0';
  pcVar5 = gStack_1108.gl_pathv[uVar19];
  pcStack_1138 = (code *)0x109487;
  pcVar9 = baseFilename(pcVar5);
  pcStack_1138 = (code *)0x109492;
  sVar8 = strlen(pcVar9);
  iVar3 = (int)sVar8;
  if ((iVar3 < 7) || (pcVar9[iVar3 - 6] != '_')) {
    pcStack_1138 = (code *)0x10966b;
    fprintf(_stderr,"don\'t know how to process %s\n",pcVar5);
  }
  else {
    uVar18 = (uint)pcVar9[iVar3 - 5];
    pcStack_1138 = (code *)0x1094d7;
    iVar3 = snprintf(acStack_10c0,499,"result/relaxng/%s_%c",auStack_ec0,(ulong)uVar18);
    if (0x1f2 < iVar3) {
      uStack_ecd = 0;
    }
    puVar16 = auStack_ec0;
    pcStack_1138 = (code *)0x10950c;
    iVar3 = snprintf(acStack_cc0,499,"result/relaxng/%s_%c.err",puVar16,(ulong)uVar18);
    uVar15 = SUB84(puVar16,0);
    if (0x1f2 < iVar3) {
      uStack_acd = 0;
    }
    if (lVar7 != 0) {
      nb_tests = nb_tests + 1;
      pcStack_1138 = (code *)0x109538;
      lVar10 = xmlReadFile(pcVar5,0,uStack_111c);
      if (lVar10 == 0) {
        pcStack_1138 = (code *)0x1096af;
        fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar5,pcStack_1128);
        uStack_1130 = 0xffffffff;
      }
      else {
        pcVar9 = acStack_10c0;
        pcStack_1138 = (code *)0x10955c;
        pcVar11 = resultFilename(pcVar9,temp_directory,".res");
        if (pcVar11 == (char *)0x0) {
          pcStack_1138 = rngStreamTest;
          rngTest_cold_2();
          uStack_1158 = 0xfffffffa;
          pcStack_1160 = pcVar5;
          lStack_1150 = lVar7;
          lStack_1148 = lVar10;
          uStack_1140 = uVar19;
          pcStack_1138 = (code *)(ulong)uVar18;
          pcVar5 = baseFilename(pcVar9);
          sVar8 = strlen(pcVar5);
          if ((int)sVar8 - 500U < 0xfffffe11) {
            fprintf(_stderr,"len(base) == %d !\n",sVar8 & 0xffffffff);
            return -1;
          }
          uVar19 = (ulong)((int)sVar8 - 4);
          memcpy(&uStack_1958,pcVar5,uVar19);
          *(undefined1 *)((long)&uStack_1958 + uVar19) = 0;
          if (((sStack_1950 == 0x31 && CONCAT44(uStack_1954,uStack_1958) == 0x5f3031726f747574) ||
              (sStack_1950 == 0x32 && CONCAT44(uStack_1954,uStack_1958) == 0x5f3031726f747574)) ||
             ((char)sStack_1950 == '\0' && CONCAT44(uStack_1954,uStack_1958) == 0x325f33726f747574))
          {
LAB_0010980c:
            bVar2 = true;
          }
          else {
            if ((CONCAT31((undefined3)uStack_1954,uStack_1958._3_1_) == 0x373733 &&
                 uStack_1958 == 0x33373033) ||
               ((char)sStack_1950 == '\0' && CONCAT44(uStack_1954,uStack_1958) == 0x325f38726f747574
               )) goto LAB_0010980c;
            bVar2 = false;
          }
          iStack_19b8 = 0;
          iVar3 = snprintf(acStack_1558,499,"./test/relaxng/%s_?.xml",&uStack_1958);
          if (0x1f2 < iVar3) {
            uStack_1365 = 0;
          }
          gStack_19a0.gl_offs = 0;
          glob64(acStack_1558,8,(__errfunc *)0x0,&gStack_19a0);
          if (gStack_19a0.gl_pathc == 0) goto LAB_001099f4;
          uVar19 = 0;
          iStack_19b8 = 0;
          goto LAB_00109897;
        }
        pcStack_1138 = (code *)0x109577;
        pFVar12 = fopen64(pcVar11,"wb");
        if (pFVar12 == (FILE *)0x0) {
          pcStack_1138 = (code *)0x1096c8;
          rngTest_cold_1();
          uStack_1130 = 0xffffffff;
        }
        else {
          pcStack_1138 = (code *)0x10958b;
          pvVar14 = (void *)xmlRelaxNGNewValidCtxt(lVar7);
          pcStack_1138 = (code *)0x1095a3;
          xmlRelaxNGSetValidErrors(pvVar14,testErrorHandler,testErrorHandler,pvVar14);
          pcStack_1138 = (code *)0x1095ae;
          pvVar13 = pvVar14;
          iVar3 = xmlRelaxNGValidateDoc(pvVar14,lVar10);
          pcVar9 = "%s validation generated an internal error\n";
          if (0 < iVar3) {
            pcVar9 = "%s fails to validate\n";
          }
          if (iVar3 == 0) {
            pcVar9 = "%s validates\n";
          }
          pcStack_1138 = (code *)0x1095d7;
          testErrorHandler(pvVar13,pcVar9,pcVar5);
          pcStack_1138 = (code *)0x1095df;
          fclose(pFVar12);
          pcStack_1138 = (code *)0x1095ec;
          iVar3 = compareFiles(pcVar11,acStack_10c0);
          if (iVar3 != 0) {
            pcStack_1138 = (code *)0x1096f6;
            fprintf(_stderr,"Result for %s on %s failed\n",pcVar5,pcStack_1128);
            uStack_1130 = 1;
          }
          pcStack_1138 = (code *)0x1095fc;
          unlink(pcVar11);
          pcStack_1138 = (code *)0x109604;
          free(pcVar11);
          pcStack_1138 = (code *)0x10960c;
          xmlRelaxNGFreeValidCtxt(pvVar14);
          pcStack_1138 = (code *)0x109614;
          xmlFreeDoc(lVar10);
          lVar7 = lStack_1118;
        }
      }
    }
    pcStack_1138 = (code *)0x109639;
    iVar3 = compareFileMem(acStack_cc0,testErrors,testErrorsSize);
    if (iVar3 != 0) {
      pcStack_1138 = (code *)0x10968d;
      fprintf(_stderr,"Error for %s on %s failed\n",pcVar5,pcStack_1128);
    }
  }
  uVar19 = uVar19 + 1;
  if (gStack_1108.gl_pathc <= uVar19) {
LAB_00109704:
    pcStack_1138 = (code *)0x10970e;
    globfree64(&gStack_1108);
    pcStack_1138 = (code *)0x109716;
    xmlRelaxNGFree(lVar7);
    return (int)uStack_1130;
  }
  goto LAB_00109460;
LAB_00109897:
  testErrorsSize = 0;
  testErrors[0] = '\0';
  pcVar5 = gStack_19a0.gl_pathv[uVar19];
  pcVar11 = baseFilename(pcVar5);
  sVar8 = strlen(pcVar11);
  iVar3 = (int)sVar8;
  if ((iVar3 < 7) || (pcVar11[iVar3 - 6] != '_')) {
    pcVar11 = "don\'t know how to process %s\n";
LAB_001099de:
    fprintf(_stderr,pcVar11,pcVar5);
  }
  else {
    cVar1 = pcVar11[iVar3 - 5];
    iVar3 = snprintf(acStack_1358,499,"result/relaxng/%s_%c",&uStack_1958,(ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar3) {
      uStack_1165 = 0;
    }
    iVar3 = snprintf(acStack_1758,499,"result/relaxng/%s_%c.err",&uStack_1958,
                     (ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar3) {
      uStack_1565 = 0;
    }
    reader = (xmlTextReaderPtr)xmlReaderForFile(pcVar5,0,uVar15);
    if (reader == (xmlTextReaderPtr)0x0) {
      fprintf(_stderr,"Failed to build reader for %s\n",pcVar5);
    }
    if (bVar2) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = acStack_1758;
    }
    iVar3 = streamProcessTest(pcVar5,acStack_1358,pcVar11,reader,pcVar9,in_R9D);
    xmlFreeTextReader(reader);
    if (iVar3 != 0) {
      iStack_19b8 = -1;
      pcVar11 = "instance %s failed\n";
      goto LAB_001099de;
    }
  }
  uVar19 = uVar19 + 1;
  if (gStack_19a0.gl_pathc <= uVar19) {
LAB_001099f4:
    globfree64(&gStack_19a0);
    return iStack_19b8;
  }
  goto LAB_00109897;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_*.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/schemas/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas != NULL) {
	    nb_tests++;
	    ret = schemasOneTest(filename, instance, result, options, schemas);
	    if (ret != 0)
		res = ret;
	}
        if (compareFileMem(err, testErrors, testErrorsSize)) {
            fprintf(stderr, "Error for %s on %s failed\n", instance,
                    filename);
            res = 1;
        }
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}